

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_1,_-1,_true>,_Eigen::internal::IndexBased,_float>
::unary_evaluator(unary_evaluator<Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>,_Eigen::internal::IndexBased,_float>
                  *this,XprType *block)

{
  long lVar1;
  
  unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_Eigen::internal::IndexBased,_float>
  ::unary_evaluator((unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_Eigen::internal::IndexBased,_float>
                     *)this,(XprType *)block);
  lVar1 = (block->
          super_BlockImpl<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true,_false>
          .m_startCol.m_value;
  (this->m_startCol).m_value = lVar1;
  (this->m_linear_offset).m_value = lVar1;
  return;
}

Assistant:

explicit unary_evaluator(const XprType& block)
    : m_argImpl(block.nestedExpression()),
      m_startRow(block.startRow()),
      m_startCol(block.startCol()),
      m_linear_offset(ForwardLinearAccess?(ArgType::IsRowMajor ? block.startRow()*block.nestedExpression().cols() + block.startCol() : block.startCol()*block.nestedExpression().rows() + block.startRow()):0)
  { }